

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_is_16_bit_from_callbacks(stbi_io_callbacks *c,void *user)

{
  int iVar1;
  undefined1 local_f0 [8];
  stbi__context s;
  
  s.io.skip = (_func_void_void_ptr_int *)c->eof;
  s._184_8_ = &s.read_from_callbacks;
  s._8_8_ = c->read;
  s.io.read = (_func_int_void_ptr_char_ptr_int *)c->skip;
  s.io_user_data = (void *)0x8000000001;
  s.buffer_start[0x78] = '\0';
  s.buffer_start[0x79] = '\0';
  s.buffer_start[0x7a] = '\0';
  s.buffer_start[0x7b] = '\0';
  s.io.eof = (_func_int_void_ptr *)user;
  s.img_buffer_end = (stbi_uc *)s._184_8_;
  stbi__refill_buffer((stbi__context *)local_f0);
  s.img_buffer_original = s.img_buffer;
  iVar1 = stbi__is_16_main((stbi__context *)local_f0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_callbacks(stbi_io_callbacks const *c, void *user)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__is_16_main(&s);
}